

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall
lzham::lzcompressor::extreme_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  vector<lzham::lzcompressor::lzdecision> *this_00;
  undefined8 uVar1;
  uint *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  dict_match *pdVar9;
  bit_cost_t bVar10;
  lzdecision *plVar11;
  ulong uVar12;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  bit_cost_t *pbVar13;
  lzdecision *plVar14;
  uint uVar15;
  long lVar16;
  node *pnVar17;
  ulong uVar18;
  uchar *puVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  uint dict_pos;
  uint uVar24;
  lzcompressor *lzbase;
  uint min_len;
  state *this_01;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  lzdecision lzdec;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  uint local_d50;
  uint local_d4c;
  lzdecision local_d48;
  uint local_d3c;
  ulong local_d38;
  uint local_d2c;
  uint local_d28;
  uint local_d24;
  parse_thread_state *local_d20;
  lzcompressor *local_d18;
  ulong local_d10;
  state *local_d08;
  uint local_cfc;
  search_accelerator *local_cf8;
  uchar *local_cf0;
  ulong local_ce8;
  bit_cost_t local_ce0;
  ulong local_cd8;
  ulong local_cd0;
  ulong local_cc8;
  long local_cc0;
  ulong local_cb8;
  uint local_cac;
  uint local_ca8;
  uint local_ca4;
  uint local_ca0;
  uint local_c9c;
  node *local_c98;
  node *local_c90;
  ulong local_c88;
  node *local_c80;
  uint *local_c78;
  node *local_c70;
  node *local_c68;
  node_state *local_c60;
  ulong local_c58;
  long local_c50;
  uint auStack_c48 [128];
  uint auStack_a48 [128];
  bit_cost_t local_848 [259];
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  auVar4 = _DAT_00122380;
  pnVar17 = (parse_state->super_raw_parse_thread_state).m_nodes;
  lVar8 = 0x4c58;
  auVar26 = _DAT_00122360;
  auVar27 = _DAT_00122370;
  do {
    auVar28 = auVar27 ^ auVar4;
    if (auVar28._4_4_ == -0x80000000 && auVar28._0_4_ < -0x7ffff3ff) {
      *(undefined4 *)((long)parse_state + lVar8 + -0x2b8) = 0;
      *(undefined4 *)((long)parse_state + lVar8 + -0x1d0) = 0;
    }
    auVar28 = auVar26 ^ auVar4;
    if (auVar28._4_4_ == -0x80000000 && auVar28._0_4_ < -0x7ffff3ff) {
      *(undefined4 *)((long)parse_state + lVar8 + -0xe8) = 0;
      *(undefined4 *)
       ((long)(parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
              m_match_hist + lVar8 + -0x10) = 0;
    }
    lVar16 = auVar27._8_8_;
    auVar27._0_8_ = auVar27._0_8_ + 4;
    auVar27._8_8_ = lVar16 + 4;
    lVar16 = auVar26._8_8_;
    auVar26._0_8_ = auVar26._0_8_ + 4;
    auVar26._8_8_ = lVar16 + 4;
    lVar8 = lVar8 + 0x3a0;
  } while (lVar8 != 0xb2ff8);
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_num_node_states = 1;
  uVar6 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_state;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.m_cur_ofs =
       (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_ofs;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.m_cur_state
       = uVar6;
  uVar1 = *(undefined8 *)
           ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist
           + 2);
  *(undefined8 *)
   (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
   m_match_hist =
       *(undefined8 *)
        (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 2) = uVar1;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_parent_index = -1;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_parent_state_index = -1;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_complexity = 0;
  uVar12 = (ulong)(parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  uVar23 = uVar12;
  local_d20 = parse_state;
  local_d18 = this;
  if (uVar12 != 0) {
    this_01 = &(parse_state->super_raw_parse_thread_state).m_approx_state;
    local_c78 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                m_match_hist;
    uVar24 = (parse_state->super_raw_parse_thread_state).m_start_ofs;
    local_cf8 = &this->m_accel;
    local_d4c = uVar24 - ((this->m_accel).m_lookahead_pos & (this->m_accel).m_max_dict_size_mask);
    local_d38 = 0;
    local_d08 = this_01;
    local_c90 = pnVar17;
    local_c88 = uVar12;
    local_c80 = pnVar17;
    do {
      pnVar17 = local_c80;
      local_d10 = (ulong)uVar24;
      local_cac = (uint)uVar12;
      if (0x100 < uVar12) {
        uVar12 = 0x101;
      }
      local_cc0 = uVar12 + (uVar12 == 0);
      local_ca0 = 0x101;
      if (local_cac < 0x101) {
        local_ca0 = local_cac;
      }
      local_ca0 = local_ca0 + (local_ca0 == 0);
      local_d2c = 0;
      if (0 < (int)(uVar24 - (parse_state->super_raw_parse_thread_state).m_approx_state.
                             m_block_start_dict_ofs)) {
        local_d2c = (uint)(local_d18->m_accel).m_dict.m_p[uVar24 - 1];
      }
      uVar15 = (int)local_c88 - (int)local_d38;
      local_c9c = (local_d18->m_accel).m_cur_dict_size + local_d4c;
      puVar19 = (local_d18->m_accel).m_dict.m_p;
      uVar6 = 0;
      local_d50 = 0;
      uVar24 = 0;
      if (1 < uVar15) {
        local_cf0 = puVar19;
        pdVar9 = search_accelerator::find_matches(local_cf8,local_d4c,true);
        if (pdVar9 == (dict_match *)0x0) {
          local_d50 = 0;
          uVar24 = 0;
        }
        else {
          local_d50 = 0;
          uVar24 = 0;
          do {
            uVar21 = pdVar9->m_len + 2;
            if (uVar15 < uVar21) {
              uVar21 = uVar15;
            }
            if (0x100 < uVar21) {
              uVar21 = 0x101;
            }
            if (uVar24 < uVar21) {
              auStack_a48[local_d50] = uVar21;
              auStack_c48[local_d50] = pdVar9->m_dist & 0x7fffffff;
              local_d50 = local_d50 + 1;
              uVar24 = uVar21;
            }
            puVar2 = &pdVar9->m_dist;
            pdVar9 = pdVar9 + 1;
          } while (-1 < (int)*puVar2);
        }
        uVar6 = search_accelerator::get_len2_match(local_cf8,local_d4c);
        puVar19 = local_cf0;
      }
      pnVar17 = pnVar17 + local_d38;
      dict_pos = (uint)local_d10;
      uVar23 = local_d38;
      local_ca4 = uVar6;
      if (pnVar17->m_num_node_states != 0) {
        local_cf0 = puVar19 + (local_d10 & 0xffffffff);
        local_c60 = pnVar17->m_node_states;
        local_ca8 = local_d2c >> 2;
        local_c70 = pnVar17 + 2;
        local_c68 = pnVar17 + 1;
        local_cd0 = (ulong)local_d50;
        uVar12 = 0;
        local_cfc = uVar24;
        local_c98 = pnVar17;
        do {
          if (uVar23 != 0) {
            uVar6 = local_c60[uVar12].m_saved_state.m_cur_state;
            (this_01->super_state_base).m_cur_ofs = local_c60[uVar12].m_saved_state.m_cur_ofs;
            (this_01->super_state_base).m_cur_state = uVar6;
            uVar1 = *(undefined8 *)(local_c60[uVar12].m_saved_state.m_match_hist + 2);
            *(undefined8 *)local_c78 = *(undefined8 *)local_c60[uVar12].m_saved_state.m_match_hist;
            *(undefined8 *)(local_c78 + 2) = uVar1;
          }
          local_d28 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                      m_cur_state * 0x40 + local_ca8;
          local_ce0 = local_c60[uVar12].m_total_cost;
          local_cc8 = (ulong)local_c60[uVar12].m_total_complexity;
          local_c58 = (ulong)(local_c60[uVar12].m_total_complexity + 2);
          uVar15 = 1;
          lVar16 = 0;
          uVar24 = 0;
          lVar8 = local_cc0;
          puVar19 = local_cf0;
          lzbase = local_d18;
          local_ce8 = uVar12;
          do {
            uVar21 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                     m_match_hist[lVar16];
            uVar23 = 0;
            if (uVar21 <= local_c9c) {
              uVar23 = 0;
              do {
                if ((lzbase->m_accel).m_dict.m_p
                    [uVar23 + ((local_d4c - uVar21) + (lzbase->m_accel).m_lookahead_pos &
                              (lzbase->m_accel).m_max_dict_size_mask)] != puVar19[uVar23])
                goto LAB_0010e7a1;
                uVar23 = uVar23 + 1;
              } while ((int)lVar8 != (int)uVar23);
              uVar23 = (ulong)local_ca0;
            }
LAB_0010e7a1:
            uVar21 = (uint)uVar23;
            if (uVar15 <= uVar21) {
              uVar6 = (uint)lVar16;
              local_d24 = uVar24;
              state::get_rep_match_costs
                        (this_01,(uint)parse_state,local_848,uVar6,uVar15,uVar21,local_d28);
              uVar20 = local_ce8;
              uVar18 = local_d10;
              uVar12 = local_d38;
              local_d3c = (int)local_c58 + uVar6;
              local_cd8 = CONCAT44(local_cd8._4_4_,~uVar6);
              local_cb8 = uVar23 & 0xffffffff;
              pnVar17 = local_c90 + uVar15;
              uVar23 = (ulong)uVar15;
              local_c50 = lVar16;
              do {
                local_d48.m_pos = (int)uVar18;
                local_d48.m_dist = (int)local_cd8;
                local_d48.m_len = (int)uVar23;
                node::add_state(pnVar17,(int)uVar12,(int)uVar20,&local_d48,local_d08,
                                local_848[uVar23] + local_ce0,local_d3c);
                pnVar17 = pnVar17 + 1;
                bVar25 = uVar23 < local_cb8;
                uVar23 = uVar23 + 1;
              } while (bVar25);
              lVar8 = local_cc0;
              lVar16 = local_c50;
              parse_state = local_d20;
              puVar19 = local_cf0;
              lzbase = local_d18;
              this_01 = local_d08;
              uVar24 = uVar21;
              if (uVar21 < local_d24) {
                uVar24 = local_d24;
              }
            }
            lVar16 = lVar16 + 1;
            uVar15 = 2;
          } while (lVar16 != 4);
          if (local_ca4 != 0) {
            local_d48.m_pos = (int)local_d10;
            local_d48.m_dist = local_ca4;
            local_d48.m_len = 2;
            bVar10 = state::get_cost(this_01,&lzbase->super_CLZBase,local_cf8,&local_d48);
            node::add_state(local_c70,(int)local_d38,(int)local_ce8,&local_d48,this_01,
                            bVar10 + local_ce0,(int)local_cc8 + 7);
            lVar8 = extraout_RDX;
            if (uVar24 < 3) {
              uVar24 = 2;
            }
          }
          if ((uVar24 < local_cfc) && (local_d50 != 0)) {
            uVar15 = uVar24 + (uVar24 == 0);
            uVar23 = 0;
            uVar12 = local_cd0;
            local_d24 = uVar24;
            do {
              uVar21 = auStack_a48[uVar23];
              if (uVar24 < uVar21) {
                min_len = uVar15 + 1;
                local_cb8 = CONCAT44(local_cb8._4_4_,auStack_c48[uVar23]);
                local_d3c = uVar21;
                local_cd8 = uVar23;
                state::get_full_match_costs
                          (local_d08,&lzbase->super_CLZBase,(uint)lVar8,local_848,
                           auStack_c48[uVar23],min_len,uVar21,local_d28);
                pnVar17 = local_c98;
                uVar20 = local_cc8;
                bVar10 = local_ce0;
                uVar18 = local_ce8;
                uVar23 = local_cd8;
                lVar8 = extraout_RDX_00;
                uVar15 = local_d3c;
                if (min_len <= local_d3c) {
                  iVar3 = (int)local_cb8;
                  do {
                    local_d48.m_pos = (int)local_d10;
                    local_d48.m_dist = iVar3;
                    local_d48.m_len = min_len;
                    node::add_state(pnVar17 + min_len,(int)local_d38,(int)uVar18,&local_d48,
                                    local_d08,local_848[min_len] + bVar10,
                                    (min_len < 9) + 6 + (int)uVar20);
                    min_len = min_len + 1;
                    uVar23 = local_cd8;
                    lVar8 = extraout_RDX_01;
                    uVar12 = local_cd0;
                    lzbase = local_d18;
                    uVar24 = local_d24;
                    uVar15 = local_d3c;
                  } while (min_len <= local_d3c);
                }
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar12);
          }
          this_01 = local_d08;
          dict_pos = (uint)local_d10;
          bVar10 = state::get_lit_cost(local_d08,local_cf8,dict_pos,local_d2c,local_d28);
          uVar12 = local_ce8;
          uVar23 = local_d38;
          local_d48.m_len = 0;
          local_d48.m_dist = 0;
          local_d48.m_pos = dict_pos;
          node::add_state(local_c68,(int)local_d38,(int)local_ce8,&local_d48,this_01,
                          local_ce0 + bVar10,(int)local_cc8 + 1);
          uVar12 = uVar12 + 1;
          parse_state = local_d20;
        } while (uVar12 < local_c98->m_num_node_states);
      }
      uVar24 = dict_pos + 1;
      local_d4c = local_d4c + 1;
      local_d38 = uVar23 + 1;
      uVar12 = (ulong)(local_cac - 1);
      local_c90 = local_c90 + 1;
      pnVar17 = local_c80;
      uVar23 = local_c88;
    } while (local_d38 != local_c88);
  }
  this_00 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
  bVar25 = elemental_vector::increase_capacity
                     ((elemental_vector *)this_00,(uint)uVar23,true,0xc,
                      vector<lzham::lzcompressor::lzdecision>::object_mover,true);
  if (bVar25) {
    if ((ulong)pnVar17[uVar23].m_num_node_states == 0) {
      uVar12 = 0;
    }
    else {
      pbVar13 = &(local_d20->super_raw_parse_thread_state).m_nodes[uVar23].m_node_states[0].
                 m_total_cost;
      uVar18 = 0xffffffffffffffff;
      uVar20 = 0;
      uVar12 = 0;
      do {
        if (*pbVar13 < uVar18) {
          uVar12 = uVar20 & 0xffffffff;
          uVar18 = *pbVar13;
        }
        uVar20 = uVar20 + 1;
        pbVar13 = pbVar13 + 7;
      } while (pnVar17[uVar23].m_num_node_states != uVar20);
    }
    plVar11 = this_00->m_p;
    plVar14 = plVar11;
    do {
      iVar22 = (int)uVar23;
      iVar7 = (int)uVar12;
      plVar14->m_dist = pnVar17[iVar22].m_node_states[iVar7].m_lzdec.m_dist;
      iVar3 = pnVar17[iVar22].m_node_states[iVar7].m_lzdec.m_len;
      plVar14->m_pos = pnVar17[iVar22].m_node_states[iVar7].m_lzdec.m_pos;
      plVar14->m_len = iVar3;
      plVar14 = plVar14 + 1;
      uVar24 = (uint)pnVar17[iVar22].m_node_states[iVar7].m_parent_index;
      uVar23 = (ulong)uVar24;
      plVar11 = plVar11 + 1;
      uVar12 = (ulong)(uint)(int)pnVar17[iVar22].m_node_states[iVar7].m_parent_state_index;
    } while (0 < (int)uVar24);
    uVar15 = (int)((ulong)((long)plVar11 -
                          (long)(local_d20->super_raw_parse_thread_state).m_best_decisions.m_p) >> 2
                  ) * -0x55555555;
    uVar24 = (local_d20->super_raw_parse_thread_state).m_best_decisions.m_size;
    if ((uVar24 != uVar15) &&
       (((uVar15 < uVar24 ||
         (uVar15 <= (local_d20->super_raw_parse_thread_state).m_best_decisions.m_capacity)) ||
        (bVar5 = elemental_vector::increase_capacity
                           ((elemental_vector *)this_00,uVar15,uVar24 + 1 == uVar15,0xc,
                            vector<lzham::lzcompressor::lzdecision>::object_mover,true), bVar5)))) {
      (local_d20->super_raw_parse_thread_state).m_best_decisions.m_size = uVar15;
    }
  }
  else {
    (parse_state->super_raw_parse_thread_state).m_failed = true;
  }
  return bVar25;
}

Assistant:

bool lzcompressor::extreme_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node *pNodes = parse_state.m_nodes;
      for (uint i = 0; i <= cMaxParseGraphNodes; i++)
      {
         pNodes[i].clear();
      }

      state &approx_state = parse_state.m_approx_state;

      pNodes[0].m_num_node_states = 1;
      node_state &first_node_state = pNodes[0].m_node_states[0];
      approx_state.save_partial_state(first_node_state.m_saved_state);
      first_node_state.m_parent_index = -1;
      first_node_state.m_parent_state_index = -1;
      first_node_state.m_total_cost = 0;
      first_node_state.m_total_complexity = 0;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node prev_lit_node;
      prev_lit_node.clear();

      while (cur_node_index < bytes_to_parse)
      {
         node* pCur_node = &pNodes[cur_node_index];

         const uint max_admissable_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.get_cur_dict_size() + cur_lookahead_ofs;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // full matches
         uint max_full_match_len = 0;
         uint num_full_matches = 0;
         uint len2_match_dist = 0;

         if (max_admissable_match_len >= cMinMatchLen)
         {
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_full_match_len)
                  {
                     max_full_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
         }

         for (uint cur_node_state_index = 0; cur_node_state_index < pCur_node->m_num_node_states; cur_node_state_index++)
         {
            node_state &cur_node_state = pCur_node->m_node_states[cur_node_state_index];

            if (cur_node_index)
            {
               LZHAM_ASSERT(cur_node_state.m_parent_index >= 0);

               approx_state.restore_partial_state(cur_node_state.m_saved_state);
            }

            uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, approx_state.m_cur_state);

            const bit_cost_t cur_node_total_cost = cur_node_state.m_total_cost;
            const uint cur_node_total_complexity = cur_node_state.m_total_complexity;

            // rep matches
            uint match_hist_max_len = 0;
            uint match_hist_min_match_len = 1;
            for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
            {
               uint hist_match_len = 0;

               uint dist = approx_state.m_match_hist[rep_match_index];
               if (dist <= find_dict_size)
               {
                  const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
                  const uint8* pComp = &m_accel.m_dict[comp_pos];

                  for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                     if (pComp[hist_match_len] != pLookahead[hist_match_len])
                        break;
               }

               if (hist_match_len >= match_hist_min_match_len)
               {
                  match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

                  approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

                  uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
                  for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
                  {
#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                     dst_node.add_state(cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, -((int)rep_match_index + 1)), approx_state, rep_match_total_cost, rep_match_total_complexity);
                  }
               }

               match_hist_min_match_len = cMinMatchLen;
            }

            uint min_truncate_match_len = match_hist_max_len;

            // nearest len2 match
            if (len2_match_dist)
            {
               lzdecision lzdec(cur_dict_ofs, 2, len2_match_dist);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, lzdec);
               pCur_node[2].add_state(cur_node_index, cur_node_state_index, lzdec, approx_state, cur_node_total_cost + actual_cost, cur_node_total_complexity + cShortMatchComplexity);

               min_truncate_match_len = LZHAM_MAX(min_truncate_match_len, 2);
            }

            // full matches
            if (max_full_match_len > min_truncate_match_len)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint end_len = match_lens[full_match_index];
                  if (end_len <= min_truncate_match_len)
                     continue;

                  uint start_len = prev_max_match_len + 1;
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     dst_node.add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, match_dist), approx_state, match_total_cost, match_total_complexity);
                  }

                  prev_max_match_len = end_len;
               }
            }

            // literal
            bit_cost_t lit_cost = approx_state.get_lit_cost(m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
            bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
            uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
            {
               lzdecision actual_dec(cur_dict_ofs, 0, 0);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
               LZHAM_ASSERT(actual_cost == lit_cost);
            }
#endif

            pCur_node[1].add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, 0, 0), approx_state, lit_total_cost, lit_total_complexity);

         } // cur_node_state_index

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;
      }

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_to_parse))
      {
         parse_state.m_failed = true;
         return false;
      }

      bit_cost_t lowest_final_cost = cBitCostMax; //math::cNearlyInfinite;
      int node_state_index = 0;
      node_state *pLast_node_states = pNodes[bytes_to_parse].m_node_states;
      for (uint i = 0; i < pNodes[bytes_to_parse].m_num_node_states; i++)
      {
         if (pLast_node_states[i].m_total_cost < lowest_final_cost)
         {
            lowest_final_cost = pLast_node_states[i].m_total_cost;
            node_state_index = i;
         }
      }

      int node_index = bytes_to_parse;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));

         node& cur_node = pNodes[node_index];
         const node_state &cur_node_state = cur_node.m_node_states[node_state_index];

         *pDst_dec++ = cur_node_state.m_lzdec;

         node_index = cur_node_state.m_parent_index;
         node_state_index = cur_node_state.m_parent_state_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      return true;
   }